

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O1

void __thiscall ktx::CommandCompare::executeCompare(CommandCompare *this)

{
  Reporter *report;
  _Alloc_hider *p_Var1;
  bool bVar2;
  OutputFormat OVar3;
  istream *stream;
  void *pvVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  CommandCompare *pCVar10;
  int iVar11;
  long *plVar12;
  undefined8 *puVar13;
  size_t i_1;
  size_type __rlen;
  size_t i;
  long lVar14;
  bool bVar15;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  basic_string_view<char> format_str_10;
  basic_string_view<char> format_str_11;
  basic_string_view<char> format_str_12;
  basic_string_view<char> format_str_13;
  basic_string_view<char> format_str_14;
  basic_string_view<char> format_str_15;
  basic_string_view<char> format_str_16;
  basic_string_view<char> format_str_17;
  basic_string_view<char> format_str_18;
  basic_string_view<char> format_str_19;
  basic_string_view<char> format_str_20;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_00;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_01;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_02;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_03;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_04;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_05;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_06;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_07;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_08;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_09;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_10;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_11;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_12;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_13;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_14;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_15;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_16;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_17;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_18;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_19;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  format_args args_20;
  format_args args_21;
  format_args args_22;
  format_args args_23;
  PrintIndent out;
  bool first;
  PrintIndent out_1;
  char *nl;
  vector<int,_std::allocator<int>_> validationResults;
  char *space;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  validationMessages;
  PrintIndent pi;
  PrintDiff diff;
  InputStreams inputStreams;
  long alStack_b58 [5];
  undefined1 auStack_b30 [272];
  undefined1 *puStack_a20;
  PrintIndent local_a10;
  undefined1 local_9f9;
  undefined1 local_9f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9e8;
  _Alloc_hider local_9d0;
  vector<int,_std::allocator<int>_> local_9c8;
  CommandCompare *local_9a8;
  PrintIndent *local_9a0;
  istream *local_998;
  int local_98c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_988;
  _Any_data local_968;
  code *local_958;
  code *pcStack_950;
  _Any_data local_948;
  code *local_938;
  code *pcStack_930;
  PrintDiff *local_928;
  undefined4 local_920;
  undefined4 local_91c;
  undefined1 local_918 [16];
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_908;
  bool local_8e8;
  undefined2 local_8e0;
  undefined1 local_8d8 [24];
  bool local_8c0;
  ios_base local_8a8 [264];
  undefined1 local_7a0 [1904];
  
  report = &(this->super_Command).super_Reporter;
  puStack_a20 = (undefined1 *)0x12af44;
  InputStream::InputStream
            ((InputStream *)local_7a0,(string *)&(this->options).super_OptionsCompare,report);
  puStack_a20 = (undefined1 *)0x12af5c;
  InputStream::InputStream
            ((InputStream *)(local_7a0 + 0x3b8),
             (this->options).super_OptionsCompare.inputFilepaths._M_elems + 1,report);
  local_988.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_988.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_988.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  OVar3 = (this->options).super_OptionsFormat.format;
  local_9a8 = this;
  if (OVar3 - json < 2) {
    bVar15 = OVar3 == json;
    local_9a0 = (PrintIndent *)0x200d21;
    if (!bVar15) {
      local_9a0 = (PrintIndent *)0x219e6c;
    }
    local_9d0._M_p = "\n";
    if (!bVar15) {
      local_9d0._M_p = "";
    }
    local_a10.indentWidth = (uint)bVar15 << 2;
    local_a10.os = (ostream *)&std::cout;
    local_a10.indentBase = 0;
    local_998 = (istream *)CONCAT44(local_998._4_4_,local_a10.indentWidth);
    local_918._0_8_ = "";
    local_908._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
    puStack_a20 = (undefined1 *)0x12b00c;
    format_str.size_ = 5;
    format_str.data_ = "{:{}}";
    args.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
    args.desc_ = 0x1c;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str,args);
    local_918._0_8_ = local_9d0._M_p;
    puStack_a20 = (undefined1 *)0x12b037;
    format_str_00.size_ = 4;
    format_str_00.data_ = "{{{}";
    args_00.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
    args_00.desc_ = 0xc;
    ::fmt::v10::vprint<char>(local_a10.os,format_str_00,args_00);
    local_908._0_4_ = (local_a10.indentBase + 1) * local_a10.indentWidth;
    local_908._4_4_ = 0;
    local_918._0_8_ = "";
    puStack_a20 = (undefined1 *)0x12b073;
    format_str_01.size_ = 5;
    format_str_01.data_ = "{:{}}";
    args_01.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
    args_01.desc_ = 0x1c;
    ::fmt::v10::vprint<char>(local_a10.os,format_str_01,args_01);
    local_918._0_8_ = local_9a0;
    local_908._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)local_9d0._M_p;
    puStack_a20 = (undefined1 *)0x12b0aa;
    format_str_02.size_ = 0x3f;
    format_str_02.data_ = "\"$schema\":{}\"https://schema.khronos.org/ktx/compare_v0.json\",{}";
    args_02.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
    args_02.desc_ = 0xcc;
    ::fmt::v10::vprint<char>(local_a10.os,format_str_02,args_02);
    lVar14 = 0x58;
    puVar13 = (undefined8 *)(local_7a0 + 0x20);
    do {
      puStack_a20 = (undefined1 *)0x12b0c5;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_918);
      local_928 = (PrintDiff *)local_918;
      local_920 = 0;
      local_91c = local_998._0_4_;
      local_9f9 = 1;
      stream = (istream *)*puVar13;
      pvVar4 = *(void **)((long)(local_9a8->options).super_OptionsCompare.inputFilepaths._M_elems +
                         lVar14 + -0x58);
      lVar5 = *(long *)((long)(local_9a8->options).super_OptionsCompare.inputFilepaths._M_elems +
                       lVar14 + -0x50);
      if (lVar5 == 1) {
        puStack_a20 = (undefined1 *)0x12b114;
        iVar11 = bcmp(pvVar4,"-",1);
        if (iVar11 != 0) goto LAB_0012b11c;
        local_9f8._0_8_ = &local_9e8;
        local_9f8._8_8_ = 5;
        local_9e8._M_allocated_capacity._0_6_ = 0x6e69647473;
      }
      else {
LAB_0012b11c:
        local_9f8._0_8_ = &local_9e8;
        puStack_a20 = (undefined1 *)0x12b137;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_9f8,pvVar4,lVar5 + (long)pvVar4);
      }
      local_958 = (code *)0x0;
      pcStack_950 = (code *)0x0;
      local_968._M_unused._M_object = (void *)0x0;
      local_968._8_8_ = 0;
      puStack_a20 = (undefined1 *)0x12b154;
      local_968._M_unused._M_object = operator_new(0x20);
      *(undefined1 **)local_968._M_unused._0_8_ = &local_9f9;
      *(PrintDiff ***)((long)local_968._M_unused._0_8_ + 8) = &local_928;
      *(_Alloc_hider **)((long)local_968._M_unused._0_8_ + 0x10) = &local_9d0;
      *(PrintIndent ***)((long)local_968._M_unused._0_8_ + 0x18) = &local_9a0;
      pcStack_950 = std::
                    _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp:1361:31)>
                    ::_M_invoke;
      local_958 = std::
                  _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp:1361:31)>
                  ::_M_manager;
      puStack_a20 = (undefined1 *)0x12b1b7;
      local_98c = validateIOStream(stream,(string *)local_9f8,false,false,
                                   (function<void_(const_ktx::ValidationReport_&)> *)&local_968);
      if (local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        puStack_a20 = (undefined1 *)0x12b1f1;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_9c8,
                   (iterator)
                   local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_98c);
      }
      else {
        *local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_98c;
        local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (local_958 != (code *)0x0) {
        puStack_a20 = (undefined1 *)0x12b210;
        (*local_958)(&local_968,&local_968,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9f8._0_8_ != &local_9e8) {
        puStack_a20 = (undefined1 *)0x12b22c;
        operator_delete((void *)local_9f8._0_8_,(ulong)(local_9e8._M_allocated_capacity + 1));
      }
      puStack_a20 = (undefined1 *)0x12b23c;
      std::__cxx11::stringbuf::str();
      puStack_a20 = (undefined1 *)0x12b24c;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_988,
                 (string *)local_9f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9f8._0_8_ != &local_9e8) {
        puStack_a20 = (undefined1 *)0x12b268;
        operator_delete((void *)local_9f8._0_8_,(ulong)(local_9e8._M_allocated_capacity + 1));
      }
      puStack_a20 = (undefined1 *)0x12b277;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_918);
      puStack_a20 = (undefined1 *)0x12b284;
      std::ios_base::~ios_base(local_8a8);
      lVar14 = lVar14 + 0x20;
      puVar13 = puVar13 + 0x77;
    } while (lVar14 == 0x78);
    local_908._0_4_ = (local_a10.indentBase + 1) * local_a10.indentWidth;
    local_908._4_4_ = 0;
    local_918._0_8_ = "";
    puStack_a20 = (undefined1 *)0x12b4df;
    format_str_03.size_ = 5;
    format_str_03.data_ = "{:{}}";
    args_03.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
    args_03.desc_ = 0x1c;
    ::fmt::v10::vprint<char>(local_a10.os,format_str_03,args_03);
    local_918._0_8_ = local_9a0;
    local_908._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)local_9d0._M_p;
    puStack_a20 = (undefined1 *)0x12b513;
    format_str_04.size_ = 0xd;
    format_str_04.data_ = "\"valid\":{}[{}";
    args_04.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
    args_04.desc_ = 0xcc;
    ::fmt::v10::vprint<char>(local_a10.os,format_str_04,args_04);
    lVar14 = 0;
    do {
      iVar11 = local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar14];
      local_908._0_4_ = (local_a10.indentBase + 2) * local_a10.indentWidth;
      local_908._4_4_ = 0;
      local_918._0_8_ = "";
      puStack_a20 = (undefined1 *)0x12b572;
      format_str_05.size_ = 5;
      format_str_05.data_ = "{:{}}";
      args_05.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
      args_05.desc_ = 0x1c;
      ::fmt::v10::vprint<char>(local_a10.os,format_str_05,args_05);
      local_918._0_8_ = ZEXT18(iVar11 == 0);
      local_908._M_value._M_dataplus._M_p = (_Alloc_hider)",";
      if (lVar14 == 1) {
        local_908._M_value._M_dataplus._M_p = (_Alloc_hider)"";
      }
      local_908._16_8_ = local_9d0._M_p;
      puStack_a20 = (undefined1 *)0x12b5bf;
      format_str_06.size_ = 6;
      format_str_06.data_ = "{}{}{}";
      args_06.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
      args_06.desc_ = 0xcc7;
      ::fmt::v10::vprint<char>(local_a10.os,format_str_06,args_06);
      lVar14 = lVar14 + 1;
    } while (lVar14 == 1);
    local_908._0_4_ = (local_a10.indentBase + 1) * local_a10.indentWidth;
    local_908._4_4_ = 0;
    local_918._0_8_ = "";
    puStack_a20 = (undefined1 *)0x12b601;
    format_str_07.size_ = 5;
    format_str_07.data_ = "{:{}}";
    args_07.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
    args_07.desc_ = 0x1c;
    ::fmt::v10::vprint<char>(local_a10.os,format_str_07,args_07);
    local_918._0_8_ = local_9d0._M_p;
    puStack_a20 = (undefined1 *)0x12b62c;
    format_str_08.size_ = 4;
    format_str_08.data_ = "],{}";
    args_08.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
    args_08.desc_ = 0xc;
    ::fmt::v10::vprint<char>(local_a10.os,format_str_08,args_08);
    local_908._0_4_ = (local_a10.indentBase + 1) * local_a10.indentWidth;
    local_908._4_4_ = 0;
    local_918._0_8_ = "";
    puStack_a20 = (undefined1 *)0x12b668;
    format_str_09.size_ = 5;
    format_str_09.data_ = "{:{}}";
    args_09.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
    args_09.desc_ = 0x1c;
    ::fmt::v10::vprint<char>(local_a10.os,format_str_09,args_09);
    local_918._0_8_ = local_9a0;
    local_908._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)local_9d0._M_p;
    puStack_a20 = (undefined1 *)0x12b69c;
    format_str_10.size_ = 0x10;
    format_str_10.data_ = "\"messages\":{}[{}";
    args_10.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
    args_10.desc_ = 0xcc;
    ::fmt::v10::vprint<char>(local_a10.os,format_str_10,args_10);
    lVar14 = 0;
    do {
      local_908._0_4_ = (local_a10.indentBase + 2) * local_a10.indentWidth;
      local_908._4_4_ = 0;
      if (*(long *)((long)&(local_988.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + lVar14)
          == 0) {
        local_918._0_8_ = "";
        puStack_a20 = (undefined1 *)0x12b871;
        format_str_17.size_ = 5;
        format_str_17.data_ = "{:{}}";
        args_17.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
        args_17.desc_ = 0x1c;
        ::fmt::v10::vprint<char>(local_a10.os,format_str_17,args_17);
        local_918._0_8_ = ",";
        if (lVar14 == 0x20) {
          local_918._0_8_ = "";
        }
        local_908._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)local_9d0._M_p;
        puStack_a20 = (undefined1 *)0x12b8b3;
        format_str_18.size_ = 6;
        format_str_18.data_ = "[]{}{}";
        args_18.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
        args_18.desc_ = 0xcc;
        ::fmt::v10::vprint<char>(local_a10.os,format_str_18,args_18);
      }
      else {
        local_918._0_8_ = "";
        puStack_a20 = (undefined1 *)0x12b70c;
        format_str_11.size_ = 5;
        format_str_11.data_ = "{:{}}";
        args_11.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
        args_11.desc_ = 0x1c;
        ::fmt::v10::vprint<char>(local_a10.os,format_str_11,args_11);
        local_918._0_8_ = local_9d0._M_p;
        puStack_a20 = (undefined1 *)0x12b737;
        format_str_12.size_ = 3;
        format_str_12.data_ = "[{}";
        args_12.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
        args_12.desc_ = 0xc;
        ::fmt::v10::vprint<char>(local_a10.os,format_str_12,args_12);
        puVar13 = (undefined8 *)
                  ((long)&((local_988.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar14);
        local_918._0_8_ = *puVar13;
        local_918._8_8_ = puVar13[1];
        puStack_a20 = (undefined1 *)0x12b764;
        fmt.size_ = 2;
        fmt.data_ = "{}";
        args_20.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
        args_20.desc_ = 0xd;
        ::fmt::v10::vprint(fmt,args_20);
        local_908._0_4_ = (local_a10.indentBase + 3) * local_a10.indentWidth;
        local_908._4_4_ = 0;
        local_918._0_8_ = "";
        puStack_a20 = (undefined1 *)0x12b7a1;
        format_str_13.size_ = 5;
        format_str_13.data_ = "{:{}}";
        args_13.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
        args_13.desc_ = 0x1c;
        ::fmt::v10::vprint<char>(local_a10.os,format_str_13,args_13);
        local_918._0_8_ = local_9d0._M_p;
        puStack_a20 = (undefined1 *)0x12b7c8;
        format_str_14.size_ = 4;
        format_str_14.data_ = "}}{}";
        args_14.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
        args_14.desc_ = 0xc;
        ::fmt::v10::vprint<char>(local_a10.os,format_str_14,args_14);
        local_908._0_4_ = (local_a10.indentBase + 2) * local_a10.indentWidth;
        local_908._4_4_ = 0;
        local_918._0_8_ = "";
        puStack_a20 = (undefined1 *)0x12b805;
        format_str_15.size_ = 5;
        format_str_15.data_ = "{:{}}";
        args_15.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
        args_15.desc_ = 0x1c;
        ::fmt::v10::vprint<char>(local_a10.os,format_str_15,args_15);
        local_918._0_8_ = ",";
        if (lVar14 == 0x20) {
          local_918._0_8_ = "";
        }
        local_908._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)local_9d0._M_p;
        puStack_a20 = (undefined1 *)0x12b843;
        format_str_16.size_ = 5;
        format_str_16.data_ = "]{}{}";
        args_16.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
        args_16.desc_ = 0xcc;
        ::fmt::v10::vprint<char>(local_a10.os,format_str_16,args_16);
      }
      lVar14 = lVar14 + 0x20;
    } while (lVar14 == 0x20);
    local_908._0_4_ = (local_a10.indentBase + 1) * local_a10.indentWidth;
    local_908._4_4_ = 0;
    local_918._0_8_ = "";
    puStack_a20 = (undefined1 *)0x12b8fd;
    format_str_19.size_ = 5;
    format_str_19.data_ = "{:{}}";
    args_19.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
    args_19.desc_ = 0x1c;
    ::fmt::v10::vprint<char>(local_a10.os,format_str_19,args_19);
    puStack_a20 = (undefined1 *)0x12b91d;
    format_str_20.size_ = 1;
    format_str_20.data_ = "]";
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_918;
    ::fmt::v10::vprint<char>
              (local_a10.os,format_str_20,
               (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
               (auVar6 << 0x40));
    pCVar10 = local_9a8;
    bVar15 = (local_9a8->options).super_OptionsCompare.allowInvalidInput;
    lVar14 = 0;
    do {
      iVar11 = local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar14];
      if (iVar11 != 0) {
        if ((iVar11 != 3) || ((bVar15 & 1U) == 0)) goto LAB_0012b957;
        (local_9a8->options).super_OptionsCompare.contentMode = ignore;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 == 1);
    iVar11 = 0;
LAB_0012b957:
    local_918._0_8_ = &local_a10;
    local_918._8_4_ = (local_9a8->options).super_OptionsFormat.format;
    local_8e8 = false;
    local_8e0._0_1_ = false;
    local_8e0._1_1_ = true;
    local_8d8._0_8_ = (pointer)0x0;
    local_8d8[8] = 0;
    local_8d8._9_7_ = 0;
    local_8d8[0x10] = 0;
    stack0xfffffffffffff739 = 0;
    if (iVar11 != 0) {
LAB_0012be63:
      puStack_a20 = (undefined1 *)0x12be6d;
      puVar13 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar13 = &PTR__exception_0025e588;
      *(int *)(puVar13 + 1) = iVar11;
      puStack_a20 = (undefined1 *)0x12be90;
      __cxa_throw(puVar13,&FatalError::typeinfo,std::exception::~exception);
    }
    local_9f8._0_8_ = &local_9e8;
    puStack_a20 = (undefined1 *)0x12b9bc;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"info","");
    puStack_a20 = (undefined1 *)0x12b9d1;
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)(local_918 + 0x10),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f8);
    local_8e0._0_1_ = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9f8._0_8_ != &local_9e8) {
      puStack_a20 = (undefined1 *)0x12b9f5;
      operator_delete((void *)local_9f8._0_8_,(ulong)(local_9e8._M_allocated_capacity + 1));
    }
    puStack_a20 = (undefined1 *)0x12ba0d;
    compareHeader(pCVar10,(PrintDiff *)local_918,(InputStreams *)local_7a0);
    puStack_a20 = (undefined1 *)0x12ba25;
    compareLevelIndex(pCVar10,(PrintDiff *)local_918,(InputStreams *)local_7a0);
    puStack_a20 = (undefined1 *)0x12ba3d;
    compareDFD(pCVar10,(PrintDiff *)local_918,(InputStreams *)local_7a0);
    puStack_a20 = (undefined1 *)0x12ba55;
    compareKVD(pCVar10,(PrintDiff *)local_918,(InputStreams *)local_7a0);
    puStack_a20 = (undefined1 *)0x12ba6d;
    compareSGD(pCVar10,(PrintDiff *)local_918,(InputStreams *)local_7a0);
    puStack_a20 = (undefined1 *)0x12ba7a;
    PrintDiff::endJsonSection((PrintDiff *)local_918);
    local_9f8._0_8_ = &local_9e8;
    puStack_a20 = (undefined1 *)0x12ba9a;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"image","");
    puStack_a20 = (undefined1 *)0x12baa7;
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)(local_918 + 0x10),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f8);
    local_8e0._0_1_ = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9f8._0_8_ != &local_9e8) {
      puStack_a20 = (undefined1 *)0x12bacb;
      operator_delete((void *)local_9f8._0_8_,(ulong)(local_9e8._M_allocated_capacity + 1));
    }
    puStack_a20 = (undefined1 *)0x12bae3;
    compareImages(pCVar10,(PrintDiff *)local_918,(InputStreams *)local_7a0);
    puStack_a20 = (undefined1 *)0x12baf0;
    PrintDiff::endJsonSection((PrintDiff *)local_918);
    if (local_8c0 == true) {
      iVar11 = 7;
      goto LAB_0012be63;
    }
    local_9f8._0_8_ = local_9d0._M_p;
    local_9e8._M_allocated_capacity = (size_type)local_9d0._M_p;
    puStack_a20 = (undefined1 *)0x12bb25;
    fmt_00.size_ = 6;
    fmt_00.data_ = "{}}}{}";
    args_21.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_9f8;
    args_21.desc_ = 0xcc;
    ::fmt::v10::vprint(fmt_00,args_21);
  }
  else {
    if (OVar3 != text) goto LAB_0012bd84;
    lVar14 = 0x58;
    puVar13 = (undefined8 *)(local_7a0 + 0x20);
    do {
      puStack_a20 = (undefined1 *)0x12b2ed;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_918);
      local_998 = (istream *)*puVar13;
      pvVar4 = *(void **)((long)(local_9a8->options).super_OptionsCompare.inputFilepaths._M_elems +
                         lVar14 + -0x58);
      lVar5 = *(long *)((long)(local_9a8->options).super_OptionsCompare.inputFilepaths._M_elems +
                       lVar14 + -0x50);
      if (lVar5 == 1) {
        puStack_a20 = (undefined1 *)0x12b31e;
        iVar11 = bcmp(pvVar4,"-",1);
        if (iVar11 != 0) goto LAB_0012b326;
        local_9f8._0_8_ = &local_9e8;
        local_9f8._8_8_ = 5;
        local_9e8._M_allocated_capacity._0_6_ = 0x6e69647473;
      }
      else {
LAB_0012b326:
        local_9f8._0_8_ = &local_9e8;
        puStack_a20 = (undefined1 *)0x12b346;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_9f8,pvVar4,lVar5 + (long)pvVar4);
      }
      local_948._8_8_ = 0;
      pcStack_930 = std::
                    _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp:1294:31)>
                    ::_M_invoke;
      local_938 = std::
                  _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp:1294:31)>
                  ::_M_manager;
      puStack_a20 = (undefined1 *)0x12b39e;
      local_948._M_unused._0_8_ = (undefined8)(ostringstream *)local_918;
      iVar11 = validateIOStream(local_998,(string *)local_9f8,false,false,
                                (function<void_(const_ktx::ValidationReport_&)> *)&local_948);
      local_a10.os = (ostream *)CONCAT44(local_a10.os._4_4_,iVar11);
      if (local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        puStack_a20 = (undefined1 *)0x12b3ca;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_9c8,
                   (iterator)
                   local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_a10);
      }
      else {
        *local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar11;
        local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (local_938 != (code *)0x0) {
        puStack_a20 = (undefined1 *)0x12b3e9;
        (*local_938)(&local_948,&local_948,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9f8._0_8_ != &local_9e8) {
        puStack_a20 = (undefined1 *)0x12b405;
        operator_delete((void *)local_9f8._0_8_,(ulong)(local_9e8._M_allocated_capacity + 1));
      }
      puStack_a20 = (undefined1 *)0x12b415;
      std::__cxx11::stringbuf::str();
      puStack_a20 = (undefined1 *)0x12b425;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_988,
                 (string *)local_9f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9f8._0_8_ != &local_9e8) {
        puStack_a20 = (undefined1 *)0x12b441;
        operator_delete((void *)local_9f8._0_8_,(ulong)(local_9e8._M_allocated_capacity + 1));
      }
      puStack_a20 = (undefined1 *)0x12b450;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_918);
      puStack_a20 = (undefined1 *)0x12b45d;
      std::ios_base::~ios_base(local_8a8);
      lVar14 = lVar14 + 0x20;
      puVar13 = puVar13 + 0x77;
    } while (lVar14 == 0x78);
    lVar14 = 0;
    bVar15 = false;
    do {
      if ((&(local_988.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length)[lVar14] != 0) {
        if (bVar15) {
          puStack_a20 = (undefined1 *)0x12bb7c;
          fmt_01.size_ = 1;
          fmt_01.data_ = "\n";
          auVar7._8_8_ = 0;
          auVar7._0_8_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                         local_918;
          ::fmt::v10::vprint(fmt_01,(format_args)(auVar7 << 0x40));
        }
        local_918._0_8_ = "failed";
        if (*(int *)((long)local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar14) == 0) {
          local_918._0_8_ = "successful";
        }
        p_Var1 = &(local_9a8->options).super_OptionsCompare.inputFilepaths._M_elems[0]._M_dataplus +
                 lVar14;
        local_908._M_value._M_dataplus._M_p = (_Alloc_hider)p_Var1->_M_p;
        local_908._M_value._M_string_length = (size_type)p_Var1[1];
        puStack_a20 = (undefined1 *)0x12bbc2;
        fmt_02.size_ = 0x17;
        fmt_02.data_ = "Validation {} for \'{}\'\n";
        args_22.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
        args_22.desc_ = 0xdc;
        ::fmt::v10::vprint(fmt_02,args_22);
        puStack_a20 = (undefined1 *)0x12bbd4;
        fmt_03.size_ = 1;
        fmt_03.data_ = "\n";
        auVar8._8_8_ = 0;
        auVar8._0_8_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918
        ;
        ::fmt::v10::vprint(fmt_03,(format_args)(auVar8 << 0x40));
        local_918._0_8_ =
             (&(local_988.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[lVar14]._M_p;
        local_918._8_8_ =
             (&(local_988.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus + lVar14)[1];
        puStack_a20 = (undefined1 *)0x12bbfd;
        fmt_04.size_ = 2;
        fmt_04.data_ = "{}";
        args_23.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_918;
        args_23.desc_ = 0xd;
        ::fmt::v10::vprint(fmt_04,args_23);
        bVar15 = true;
      }
      pCVar10 = local_9a8;
      lVar14 = lVar14 + 4;
    } while (lVar14 == 4);
    bVar2 = (local_9a8->options).super_OptionsCompare.allowInvalidInput;
    lVar14 = 0;
    do {
      if (local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar14] != 0) {
        if ((local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar14] != 3) || ((bVar2 & 1U) == 0)) {
          puStack_a20 = (undefined1 *)0x12be2e;
          puVar13 = (undefined8 *)__cxa_allocate_exception(0x10);
          iVar11 = local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar14];
          *puVar13 = &PTR__exception_0025e588;
          *(int *)(puVar13 + 1) = iVar11;
          puStack_a20 = &LAB_0012be59;
          __cxa_throw(puVar13,&FatalError::typeinfo,std::exception::~exception);
        }
        (local_9a8->options).super_OptionsCompare.contentMode = ignore;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 == 1);
    if (bVar15) {
      puStack_a20 = (undefined1 *)0x12bc71;
      fmt_05.size_ = 1;
      fmt_05.data_ = "\n";
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_918;
      ::fmt::v10::vprint(fmt_05,(format_args)(auVar9 << 0x40));
    }
    local_9f8._0_8_ = &std::cout;
    local_9f8._8_8_ = 0x400000000;
    local_918._8_4_ = (pCVar10->options).super_OptionsFormat.format;
    local_8e8 = false;
    local_8e0._0_1_ = false;
    local_8e0._1_1_ = true;
    local_8d8._0_8_ = (pointer)0x0;
    local_8d8[8] = 0;
    local_8d8._9_7_ = 0;
    local_8d8[0x10] = 0;
    stack0xfffffffffffff739 = 0;
    puStack_a20 = (undefined1 *)0x12bcc3;
    local_918._0_8_ = (PrintIndent *)local_9f8;
    compareHeader(pCVar10,(PrintDiff *)local_918,(InputStreams *)local_7a0);
    puStack_a20 = (undefined1 *)0x12bcdb;
    compareLevelIndex(pCVar10,(PrintDiff *)local_918,(InputStreams *)local_7a0);
    puStack_a20 = (undefined1 *)0x12bcf3;
    compareDFD(pCVar10,(PrintDiff *)local_918,(InputStreams *)local_7a0);
    puStack_a20 = (undefined1 *)0x12bd0b;
    compareKVD(pCVar10,(PrintDiff *)local_918,(InputStreams *)local_7a0);
    puStack_a20 = (undefined1 *)0x12bd23;
    compareSGD(pCVar10,(PrintDiff *)local_918,(InputStreams *)local_7a0);
    puStack_a20 = (undefined1 *)0x12bd3b;
    compareImages(pCVar10,(PrintDiff *)local_918,(InputStreams *)local_7a0);
    if (local_8c0 == true) {
      puStack_a20 = (undefined1 *)0x12be9a;
      puVar13 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar13 = &PTR__exception_0025e588;
      *(undefined4 *)(puVar13 + 1) = 7;
      puStack_a20 = &LAB_0012bec1;
      __cxa_throw(puVar13,&FatalError::typeinfo,std::exception::~exception);
    }
  }
  puStack_a20 = (undefined1 *)0x12bd59;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_918 + 0x40));
  if (local_8e8 == true) {
    local_8e8 = false;
    if (local_908._M_value._M_dataplus._M_p != (_Alloc_hider)(local_918 + 0x20)) {
      puStack_a20 = (undefined1 *)0x12bd84;
      operator_delete((void *)local_908._M_value._M_dataplus._M_p,(ulong)(local_908._16_8_ + 1));
    }
  }
LAB_0012bd84:
  if (local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    puStack_a20 = (undefined1 *)0x12bd9b;
    operator_delete(local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_9c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  puStack_a20 = (undefined1 *)0x12bda8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_988);
  lVar14 = 0x770;
  do {
    puStack_a20 = (undefined1 *)0x12bdc8;
    std::__cxx11::stringstream::~stringstream((stringstream *)((long)&local_928 + lVar14));
    puStack_a20 = (undefined1 *)0x12bdd8;
    std::ios_base::~ios_base(local_8a8 + lVar14);
    puStack_a20 = (undefined1 *)0x12bdeb;
    std::ifstream::~ifstream(auStack_b30 + lVar14);
    plVar12 = (long *)((long)alStack_b58 + lVar14 + 0x10);
    if (plVar12 != *(long **)((long)alStack_b58 + lVar14)) {
      puStack_a20 = (undefined1 *)0x12be09;
      operator_delete(*(long **)((long)alStack_b58 + lVar14),*plVar12 + 1);
    }
    lVar14 = lVar14 + -0x3b8;
  } while (lVar14 != 0);
  return;
}

Assistant:

void CommandCompare::executeCompare() {
    InputStreams inputStreams{
        InputStream(options.inputFilepaths[0], *this),
        InputStream(options.inputFilepaths[1], *this),
    };

    std::vector<std::string> validationMessages;
    std::vector<int> validationResults;

    switch (options.format) {
    case OutputFormat::text: {
        for (std::size_t i = 0; i < inputStreams.size(); ++i) {
            std::ostringstream messagesOS;
            validationResults.emplace_back(validateIOStream(inputStreams[i], fmtInFile(options.inputFilepaths[i]),
                false, false, [&](const ValidationReport& issue) {
                fmt::print(messagesOS, "{}-{:04}: {}\n", toString(issue.type), issue.id, issue.message);
                fmt::print(messagesOS, "    {}\n", issue.details);
            }));

            validationMessages.emplace_back(std::move(messagesOS).str());
        }

        bool hasValidationMessages = false;
        for (std::size_t i = 0; i < inputStreams.size(); ++i) {
            if (!validationMessages[i].empty()) {
                if (std::exchange(hasValidationMessages, true))
                    fmt::print("\n");

                fmt::print("Validation {} for '{}'\n", validationResults[i] == 0 ? "successful" : "failed",
                            options.inputFilepaths[i]);
                fmt::print("\n");
                fmt::print("{}", validationMessages[i]);
            }
        }

        for (std::size_t i = 0; i < inputStreams.size(); ++i) {
            if (validationResults[i] != 0) {
                if (validationResults[i] != +rc::INVALID_FILE || !options.allowInvalidInput)
                    throw FatalError(ReturnCode{validationResults[i]});

                // Image comparison is only supported for valid input files
                options.contentMode = ContentMode::ignore;
            }
        }

        if (hasValidationMessages)
            fmt::print("\n");

        PrintIndent out{std::cout};
        PrintDiff diff(out, options.format);
        compareHeader(diff, inputStreams);
        compareLevelIndex(diff, inputStreams);
        compareDFD(diff, inputStreams);
        compareKVD(diff, inputStreams);
        compareSGD(diff, inputStreams);
        compareImages(diff, inputStreams);

        if (diff.isDifferent())
            throw FatalError(rc::DIFFERENCE_FOUND);

        break;
    }
    case OutputFormat::json: [[fallthrough]];
    case OutputFormat::json_mini: {
        int fatalValidationError = 0;

        const auto baseIndent = options.format == OutputFormat::json ? +0 : 0;
        const auto indentWidth = options.format == OutputFormat::json ? 4 : 0;
        const auto space = options.format == OutputFormat::json ? " " : "";
        const auto nl = options.format == OutputFormat::json ? "\n" : "";

        PrintIndent out{std::cout, baseIndent, indentWidth};
        out(0, "{{{}", nl);
        out(1, "\"$schema\":{}\"https://schema.khronos.org/ktx/compare_v0.json\",{}", space, nl);

        for (std::size_t i = 0; i < inputStreams.size(); ++i) {
            std::ostringstream messagesOS;
            PrintIndent pi{messagesOS, baseIndent, indentWidth};

            bool first = true;
            validationResults.emplace_back(validateIOStream(inputStreams[i], fmtInFile(options.inputFilepaths[i]),
                false, false, [&](const ValidationReport& issue) {
                if (!std::exchange(first, false)) {
                    pi(3, "}},{}", nl);
                }
                pi(3, "{{{}", nl);
                pi(4, "\"id\":{}{},{}", space, issue.id, nl);
                pi(4, "\"type\":{}\"{}\",{}", space, toString(issue.type), nl);
                pi(4, "\"message\":{}\"{}\",{}", space, escape_json_copy(issue.message), nl);
                pi(4, "\"details\":{}\"{}\"{}", space, escape_json_copy(issue.details), nl);
            }));

            validationMessages.emplace_back(std::move(messagesOS).str());
        }

        out(1, "\"valid\":{}[{}", space, nl);
        for (std::size_t i = 0; i < inputStreams.size(); ++i) {
            bool last = (i == inputStreams.size() - 1);
            out(2, "{}{}{}", validationResults[i] == 0, last ? "" : ",", nl);
        }
        out(1, "],{}", nl);

        out(1, "\"messages\":{}[{}", space, nl);
        for (std::size_t i = 0; i < inputStreams.size(); ++i) {
            bool last = (i == inputStreams.size() - 1);
            if (!validationMessages[i].empty()) {
                out(2, "[{}", nl);
                fmt::print("{}", validationMessages[i]);
                out(3, "}}{}", nl);
                out(2, "]{}{}", last ? "" : ",", nl);
            } else {
                out(2, "[]{}{}", last ? "" : ",", nl);
            }
        }
        out(1, "]");

        for (std::size_t i = 0; i < inputStreams.size(); ++i) {
            if (validationResults[i] != 0) {
                if (validationResults[i] != +rc::INVALID_FILE || !options.allowInvalidInput) {
                    fatalValidationError = validationResults[i];
                    break;
                }

                // Image comparison is only supported for valid input files
                options.contentMode = ContentMode::ignore;
            }
        }

        PrintDiff diff(out, options.format);

        try {
            if (fatalValidationError)
                throw FatalError(ReturnCode{fatalValidationError});

            diff.beginJsonSection("info");
            compareHeader(diff, inputStreams);
            compareLevelIndex(diff, inputStreams);
            compareDFD(diff, inputStreams);
            compareKVD(diff, inputStreams);
            compareSGD(diff, inputStreams);
            diff.endJsonSection();

            diff.beginJsonSection("image");
            compareImages(diff, inputStreams);
            diff.endJsonSection();

            if (diff.isDifferent())
                throw FatalError(rc::DIFFERENCE_FOUND);
        } catch (...) {
            diff.endJsonSection();
            fmt::print("{}}}{}", nl, nl);
            throw;
        }
        fmt::print("{}}}{}", nl, nl);
        break;
    }
    }
}